

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketContext.h
# Opt level: O2

bool uWS::WebSocketContext<true,_true>::setCompressed(WebSocketState<true> *wState,void *s)

{
  char cVar1;
  long lVar2;
  
  lVar2 = us_socket_ext(1);
  cVar1 = *(char *)(lVar2 + 0x5d);
  if (cVar1 == '\x01') {
    *(undefined1 *)(lVar2 + 0x5d) = 2;
  }
  return cVar1 == '\x01';
}

Assistant:

static bool setCompressed(uWS::WebSocketState<isServer> *wState, void *s) {
        WebSocketData *webSocketData = (WebSocketData *) us_socket_ext(SSL, (us_socket_t *) s);

        if (webSocketData->compressionStatus == WebSocketData::CompressionStatus::ENABLED) {
            webSocketData->compressionStatus = WebSocketData::CompressionStatus::COMPRESSED_FRAME;
            return true;
        } else {
            return false;
        }
    }